

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

ProString * __thiscall QHash<ProKey,_ProString>::value(QHash<ProKey,_ProString> *this,ProKey *key)

{
  ProString *pPVar1;
  ProString *in_RDI;
  ProString *v;
  ProString *in_stack_ffffffffffffffc8;
  ProString *pPVar2;
  
  pPVar2 = in_RDI;
  pPVar1 = valueImpl<ProKey>((QHash<ProKey,_ProString> *)in_RDI,(ProKey *)in_RDI);
  if (pPVar1 == (ProString *)0x0) {
    ProString::ProString(in_RDI);
  }
  else {
    ProString::ProString(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pPVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }